

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringEq
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringEq *curr)

{
  Literal *pLVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  Literal right;
  undefined1 local_e0 [8];
  Flow flow;
  undefined1 local_80 [8];
  Literal left;
  long local_58;
  shared_ptr<wasm::GCData> leftData;
  shared_ptr<wasm::GCData> rightData;
  
  visit((Flow *)local_e0,this,curr->left);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar1 = Flow::getSingleValue((Flow *)local_e0);
    ::wasm::Literal::Literal((Literal *)local_80,pLVar1);
    visit((Flow *)&stack0xfffffffffffffed8,this,curr->right);
    Flow::operator=((Flow *)local_e0,(Flow *)&stack0xfffffffffffffed8);
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&stack0xfffffffffffffed8);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      pLVar1 = Flow::getSingleValue((Flow *)local_e0);
      ::wasm::Literal::Literal((Literal *)&stack0xfffffffffffffed8,pLVar1);
      ::wasm::Literal::getGCData();
      ::wasm::Literal::getGCData();
      if (curr->op == StringEqEqual) {
        bVar7 = local_58 == 0 &&
                leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 && local_58 != 0) {
          bVar7 = SmallVector<wasm::Literal,_1UL>::operator==
                            ((SmallVector<wasm::Literal,_1UL> *)(local_58 + 8),
                             (SmallVector<wasm::Literal,_1UL> *)
                             &(leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_M_use_count);
        }
        flow.breakTo.super_IString.str._M_str._0_4_ = (uint)bVar7;
        __return_storage_ptr__ = __return_storage_ptr__;
      }
      else {
        rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
        if (curr->op != StringEqCompare) {
          ::wasm::handle_unreachable
                    ("bad op",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                     ,0x8fd);
        }
        if (local_58 == 0 ||
            leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        left.type.id = local_58 + 0x10;
        uVar5 = 0;
        do {
          uVar6 = (ulong)uVar5;
          uVar2 = ((long)leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi[3]._vptr__Sp_counted_base -
                  *(long *)&leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[2]._M_use_count) / 0x18 +
                  *(long *)&(leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count;
          if ((*(long *)(local_58 + 0x30) - *(long *)(local_58 + 0x28)) / 0x18 +
              *(long *)(local_58 + 8) == uVar6) {
            flow.breakTo.super_IString.str._M_str._0_4_ = -(uint)(uVar2 != uVar6);
            __return_storage_ptr__ =
                 (Flow *)rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
            goto LAB_001ceca1;
          }
          if (uVar2 == uVar6) break;
          lVar3 = ::wasm::Literal::getInteger();
          lVar4 = ::wasm::Literal::getInteger();
          if (lVar3 < lVar4) {
            flow.breakTo.super_IString.str._M_str._0_4_ = 0xffffffff;
            __return_storage_ptr__ =
                 (Flow *)rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
            goto LAB_001ceca1;
          }
          uVar5 = uVar5 + 1;
        } while (lVar3 <= lVar4);
        flow.breakTo.super_IString.str._M_str._0_4_ = 1;
        __return_storage_ptr__ =
             (Flow *)rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      }
LAB_001ceca1:
      Flow::Flow(__return_storage_ptr__,(Literal *)&flow.breakTo.super_IString.str._M_str);
      ::wasm::Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rightData);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&leftData);
      ::wasm::Literal::~Literal((Literal *)&stack0xfffffffffffffed8);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_e0);
    }
    ::wasm::Literal::~Literal((Literal *)local_80);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_e0);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringEq(StringEq* curr) {
    NOTE_ENTER("StringEq");
    Flow flow = visit(curr->left);
    if (flow.breaking()) {
      return flow;
    }
    auto left = flow.getSingleValue();
    flow = visit(curr->right);
    if (flow.breaking()) {
      return flow;
    }
    auto right = flow.getSingleValue();
    NOTE_EVAL2(left, right);
    auto leftData = left.getGCData();
    auto rightData = right.getGCData();
    int32_t result;
    switch (curr->op) {
      case StringEqEqual: {
        // They are equal if both are null, or both are non-null and equal.
        result =
          (!leftData && !rightData) ||
          (leftData && rightData && leftData->values == rightData->values);
        break;
      }
      case StringEqCompare: {
        if (!leftData || !rightData) {
          trap("null ref");
        }
        auto& leftValues = leftData->values;
        auto& rightValues = rightData->values;
        Index i = 0;
        while (1) {
          if (i == leftValues.size() && i == rightValues.size()) {
            // We reached the end, and they are equal.
            result = 0;
            break;
          } else if (i == leftValues.size()) {
            // The left string is short.
            result = -1;
            break;
          } else if (i == rightValues.size()) {
            result = 1;
            break;
          }
          auto left = leftValues[i].getInteger();
          auto right = rightValues[i].getInteger();
          if (left < right) {
            // The left character is lower.
            result = -1;
            break;
          } else if (left > right) {
            result = 1;
            break;
          } else {
            // Look further.
            i++;
          }
        }
        break;
      }
      default: {
        WASM_UNREACHABLE("bad op");
      }
    }
    return Literal(result);
  }